

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_utl.cc
# Opt level: O2

int x509v3_a2i_ipadd(uint8_t *ipout,char *ipasc)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  long lVar6;
  ulong __n;
  undefined8 local_4c;
  undefined8 uStack_44;
  undefined8 local_3c;
  int local_34;
  
  pcVar5 = strchr(ipasc,0x3a);
  if (pcVar5 == (char *)0x0) {
    iVar4 = ipv4_from_asc(ipout,ipasc);
    iVar4 = iVar4 << 2;
  }
  else {
    local_3c = -0x100000000;
    local_34 = 0;
    iVar4 = 0;
    iVar3 = CONF_parse_list(ipasc,0x3a,0,ipv6_cb,&local_4c);
    if (iVar3 != 0) {
      uVar2 = local_3c._4_4_;
      __n = (ulong)local_3c._4_4_;
      uVar1 = (uint)local_3c;
      lVar6 = (long)(int)(uint)local_3c;
      iVar4 = 0x10;
      if (__n == 0xffffffff) {
        if ((uint)local_3c != 0x10) {
          return 0;
        }
      }
      else {
        if (0xf < (int)(uint)local_3c) {
          return 0;
        }
        if (3 < local_34) {
          return 0;
        }
        if (local_34 == 2) {
          if ((uint)local_3c != local_3c._4_4_ && __n != 0) {
            return 0;
          }
        }
        else if (local_34 == 3) {
          if (0 < (int)(uint)local_3c) {
            return 0;
          }
        }
        else if ((uint)local_3c == local_3c._4_4_ || __n == 0) {
          return 0;
        }
        if (-1 < local_3c) {
          if (__n == 0) {
            __n = 0;
          }
          else {
            memcpy(ipout,&local_4c,__n);
          }
          memset(ipout + __n,0,(ulong)(0x10 - uVar1));
          if (uVar1 == uVar2) {
            return 0x10;
          }
          memcpy(ipout + __n + (0x10 - lVar6),(void *)((long)&local_4c + __n),
                 (long)(int)(uVar1 - uVar2));
          return 0x10;
        }
      }
      *(undefined8 *)ipout = local_4c;
      *(undefined8 *)(ipout + 8) = uStack_44;
    }
  }
  return iVar4;
}

Assistant:

int x509v3_a2i_ipadd(uint8_t ipout[16], const char *ipasc) {
  // If string contains a ':' assume IPv6

  if (strchr(ipasc, ':')) {
    if (!ipv6_from_asc(ipout, ipasc)) {
      return 0;
    }
    return 16;
  } else {
    if (!ipv4_from_asc(ipout, ipasc)) {
      return 0;
    }
    return 4;
  }
}